

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  byte *pbVar4;
  byte bVar5;
  BYTE BVar6;
  ushort uVar7;
  ulong uVar8;
  undefined8 uVar9;
  ushort uVar10;
  uint uVar11;
  uint8_t *puVar12;
  ushort *puVar13;
  long lVar14;
  ushort *puVar15;
  BYTE *pBVar16;
  size_t __n;
  BYTE *pBVar17;
  BYTE *__src;
  ulong uVar18;
  BYTE *s;
  ushort *puVar19;
  ushort *__src_00;
  uint uVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  ushort *puVar23;
  BYTE *d;
  BYTE *d_1;
  BYTE *pBVar24;
  BYTE *pBVar25;
  ulong uVar26;
  int local_88;
  int local_78;
  
  uVar18 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar18 == 0) {
    uVar11 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (uint8_t *)dest) {
      if (uVar18 < 0xffff) {
        uVar8 = LZ4_streamDecode->table[1];
        if (uVar8 != 0) {
          if (source == (char *)0x0) {
            return -1;
          }
          puVar12 = (LZ4_streamDecode->internal_donotuse).externalDict + uVar8;
          if ((LZ4_streamDecode->internal_donotuse).externalDict == (uint8_t *)0x0) {
            puVar12 = (uint8_t *)0x0;
          }
          if (maxOutputSize == 0) {
            if (compressedSize != 1) {
              return -1;
            }
            return -(uint)(*source != '\0');
          }
          if (compressedSize == 0) {
            return -1;
          }
          __src = (BYTE *)(dest + -uVar18);
          puVar1 = (ushort *)(source + compressedSize);
          pBVar2 = (BYTE *)(dest + maxOutputSize);
          puVar23 = (ushort *)source;
          pBVar25 = (BYTE *)dest;
          if (maxOutputSize < 0x40) goto LAB_001129e4;
LAB_001126c1:
          __src_00 = (ushort *)((long)puVar23 + 1);
          bVar5 = (byte)*puVar23;
          uVar18 = (ulong)(uint)(bVar5 >> 4);
          if (bVar5 >> 4 == 0xf) {
            if ((ushort *)((long)puVar1 - 0xfU) <= __src_00) goto LAB_001129c8;
            puVar15 = puVar23 + 1;
            uVar20 = 0;
            puVar23 = puVar23 + 8;
            do {
              puVar19 = __src_00;
              puVar13 = puVar23;
              __src_00 = (ushort *)((long)puVar19 + 1);
              uVar20 = uVar20 + *(byte *)((long)puVar13 + -0xf);
              puVar15 = (ushort *)((long)puVar15 + 1);
              puVar23 = (ushort *)((long)puVar13 + 1);
            } while (puVar13 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                     *(byte *)((long)puVar13 + -0xf) == 0xff);
            uVar18 = (ulong)uVar20 + 0xf;
            pBVar24 = pBVar25 + uVar18;
            if ((CARRY8((ulong)pBVar25,uVar18)) || ((ulong)-(long)puVar15 < uVar18)) {
              __src_00 = puVar13 + -7;
              goto LAB_001129c8;
            }
            uVar11 = (uint)bVar5;
            if (dest + (long)maxOutputSize + -0x20 < pBVar24) goto LAB_00112ace;
            puVar23 = (ushort *)((ulong)uVar20 + (long)puVar13 + 1);
            if (puVar1 + -0x10 < puVar23) {
              __src_00 = puVar13 + -7;
              uVar11 = (uint)bVar5;
              goto LAB_00112ace;
            }
            lVar14 = 0;
            do {
              uVar9 = *(undefined8 *)((byte *)((long)__src_00 + lVar14) + 8);
              pBVar21 = pBVar25 + lVar14;
              *(undefined8 *)pBVar21 = *(undefined8 *)((long)__src_00 + lVar14);
              *(undefined8 *)(pBVar21 + 8) = uVar9;
              pbVar4 = (byte *)((long)puVar19 + lVar14 + 0x11);
              uVar9 = *(undefined8 *)(pbVar4 + 8);
              *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)pbVar4;
              *(undefined8 *)(pBVar21 + 0x18) = uVar9;
              lVar14 = lVar14 + 0x20;
            } while (pBVar21 + 0x20 < pBVar24);
          }
          else {
            pBVar24 = pBVar25 + uVar18;
            uVar11 = (uint)bVar5;
            if ((ushort *)((long)puVar1 - 0x11U) < __src_00) goto LAB_00112ace;
            uVar9 = *(undefined8 *)((long)puVar23 + 9);
            *(undefined8 *)pBVar25 = *(undefined8 *)__src_00;
            *(undefined8 *)(pBVar25 + 8) = uVar9;
            puVar23 = (ushort *)(uVar18 + (long)__src_00);
          }
          uVar7 = *puVar23;
          uVar18 = (ulong)uVar7;
          __src_00 = puVar23 + 1;
          pBVar21 = pBVar24 + -uVar18;
          uVar26 = (ulong)(bVar5 & 0xf);
          if (uVar26 == 0xf) {
            if ((uVar8 < 0x10000) && (pBVar21 + uVar8 < __src)) goto LAB_001129c8;
            uVar11 = 0;
            puVar23 = __src_00;
            do {
              __src_00 = (ushort *)((long)puVar23 + 1);
              if (puVar1 + -2 <= __src_00) goto LAB_001129c8;
              uVar10 = *puVar23;
              uVar11 = uVar11 + (byte)uVar10;
              puVar23 = __src_00;
            } while ((byte)uVar10 == 0xff);
            uVar26 = (ulong)uVar11;
            if ((BYTE *)(-uVar26 - 0x10) < pBVar24) goto LAB_001129c8;
            __n = uVar26 + 0x13;
            if (pBVar2 + -0x40 <= pBVar24 + uVar26 + 0x13) goto LAB_00112b75;
LAB_00112860:
            if ((uVar8 < 0x10000) && (pBVar21 + uVar8 < __src)) goto LAB_001129c8;
            pBVar3 = pBVar24 + __n;
            puVar23 = __src_00;
            pBVar25 = pBVar3;
            if (pBVar21 < __src) {
              if (pBVar2 + -5 < pBVar3) goto LAB_001129c8;
              uVar18 = (long)__src - (long)pBVar21;
              uVar26 = __n - uVar18;
              if (__n < uVar18 || uVar26 == 0) {
                memmove(pBVar24,puVar12 + -uVar18,__n);
              }
              else {
                memcpy(pBVar24,puVar12 + -uVar18,uVar18);
                pBVar25 = pBVar24 + uVar18;
                pBVar24 = __src;
                if ((ulong)((long)pBVar25 - (long)__src) < uVar26) {
                  for (; pBVar25 < pBVar3; pBVar25 = pBVar25 + 1) {
                    *pBVar25 = *pBVar24;
                    pBVar24 = pBVar24 + 1;
                  }
                }
                else {
                  memcpy(pBVar25,__src,uVar26);
                  pBVar25 = pBVar3;
                }
              }
            }
            else if (uVar7 < 0x10) {
              LZ4_memcpy_using_offset(pBVar24,pBVar21,pBVar3,uVar18);
            }
            else {
              do {
                uVar9 = *(undefined8 *)(pBVar24 + -uVar18 + 8);
                *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar24 + -uVar18);
                *(undefined8 *)(pBVar24 + 8) = uVar9;
                uVar9 = *(undefined8 *)(pBVar24 + -uVar18 + 0x10 + 8);
                *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar24 + -uVar18 + 0x10);
                *(undefined8 *)(pBVar24 + 0x18) = uVar9;
                pBVar24 = pBVar24 + 0x20;
              } while (pBVar24 < pBVar3);
            }
          }
          else {
            __n = uVar26 + 4;
            if (pBVar2 + -0x40 <= pBVar24 + uVar26 + 4) goto LAB_00112b75;
            if ((pBVar21 < __src) || (uVar7 < 8)) goto LAB_00112860;
            *(undefined8 *)pBVar24 = *(undefined8 *)pBVar21;
            *(undefined8 *)(pBVar24 + 8) = *(undefined8 *)(pBVar21 + 8);
            *(undefined2 *)(pBVar24 + 0x10) = *(undefined2 *)(pBVar21 + 0x10);
            puVar23 = __src_00;
            pBVar25 = pBVar24 + uVar26 + 4;
          }
          goto LAB_001126c1;
        }
        uVar11 = LZ4_decompress_safe_withSmallPrefix
                           (source,dest,compressedSize,maxOutputSize,uVar18);
      }
      else {
        uVar11 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
      }
      goto LAB_001129a9;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar18;
    puVar12 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar18;
    (LZ4_streamDecode->internal_donotuse).externalDict = puVar12;
    uVar11 = LZ4_decompress_safe_forceExtDict
                       (source,dest,compressedSize,maxOutputSize,puVar12,uVar18);
  }
  if ((int)uVar11 < 1) {
    return uVar11;
  }
  LZ4_streamDecode->table[3] = (ulong)uVar11;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = (uint8_t *)(dest + uVar11);
  return uVar11;
LAB_00112b75:
  if ((uVar8 < 0x10000) && (pBVar21 + uVar8 < __src)) goto LAB_001129c8;
  pBVar3 = pBVar24 + __n;
  puVar23 = __src_00;
  pBVar25 = pBVar3;
  if (pBVar21 < __src) {
    if (pBVar2 + -5 < pBVar3) goto LAB_001129c8;
    uVar18 = (long)__src - (long)pBVar21;
    uVar26 = __n - uVar18;
    if (__n < uVar18 || uVar26 == 0) {
      memmove(pBVar24,puVar12 + -uVar18,__n);
    }
    else {
      memcpy(pBVar24,puVar12 + -uVar18,uVar18);
      pBVar25 = pBVar24 + uVar18;
      pBVar24 = __src;
      if ((ulong)((long)pBVar25 - (long)__src) < uVar26) {
        for (; pBVar25 < pBVar3; pBVar25 = pBVar25 + 1) {
          *pBVar25 = *pBVar24;
          pBVar24 = pBVar24 + 1;
        }
      }
      else {
        memcpy(pBVar25,__src,uVar26);
        pBVar25 = pBVar3;
      }
    }
  }
  else {
    if ((uint)uVar18 < 8) {
      pBVar24[0] = '\0';
      pBVar24[1] = '\0';
      pBVar24[2] = '\0';
      pBVar24[3] = '\0';
      *pBVar24 = *pBVar21;
      pBVar24[1] = pBVar21[1];
      pBVar24[2] = pBVar21[2];
      pBVar24[3] = pBVar21[3];
      uVar18 = (ulong)((uint)uVar18 << 2);
      uVar26 = (ulong)*(uint *)((long)inc32table + uVar18);
      *(undefined4 *)(pBVar24 + 4) = *(undefined4 *)(pBVar21 + uVar26);
      pBVar21 = pBVar21 + (uVar26 - (long)*(int *)((long)dec64table + uVar18));
    }
    else {
      *(undefined8 *)pBVar24 = *(undefined8 *)pBVar21;
      pBVar21 = pBVar21 + 8;
    }
    pBVar16 = pBVar24 + 8;
    if (pBVar2 + -0xc < pBVar3) {
      if (pBVar2 + -5 < pBVar3) goto LAB_001129c8;
      pBVar24 = pBVar2 + -7;
      pBVar17 = pBVar21;
      pBVar22 = pBVar16;
      if (pBVar16 < pBVar24) {
        do {
          *(undefined8 *)pBVar22 = *(undefined8 *)pBVar17;
          pBVar22 = pBVar22 + 8;
          pBVar17 = pBVar17 + 8;
        } while (pBVar22 < pBVar24);
        pBVar21 = pBVar21 + ((long)pBVar24 - (long)pBVar16);
        pBVar16 = pBVar24;
      }
      for (; pBVar16 < pBVar3; pBVar16 = pBVar16 + 1) {
        BVar6 = *pBVar21;
        pBVar21 = pBVar21 + 1;
        *pBVar16 = BVar6;
      }
    }
    else {
      *(undefined8 *)pBVar16 = *(undefined8 *)pBVar21;
      if (0x10 < __n) {
        pBVar24 = pBVar24 + 0x10;
        do {
          pBVar21 = pBVar21 + 8;
          *(undefined8 *)pBVar24 = *(undefined8 *)pBVar21;
          pBVar24 = pBVar24 + 8;
        } while (pBVar24 < pBVar3);
      }
    }
  }
LAB_001129e4:
  while( true ) {
    __src_00 = (ushort *)((long)puVar23 + 1);
    bVar5 = (byte)*puVar23;
    uVar18 = (ulong)(uint)(bVar5 >> 4);
    if (bVar5 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= __src_00) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar25)) goto LAB_00112aca;
    uVar9 = *(undefined8 *)((long)puVar23 + 9);
    *(undefined8 *)pBVar25 = *(undefined8 *)__src_00;
    *(undefined8 *)(pBVar25 + 8) = uVar9;
    pBVar24 = pBVar25 + uVar18;
    uVar26 = (ulong)(bVar5 & 0xf);
    puVar23 = (ushort *)(uVar18 + (long)__src_00);
    __src_00 = puVar23 + 1;
    uVar7 = *puVar23;
    uVar18 = (ulong)uVar7;
    pBVar21 = pBVar24 + -uVar18;
    if (((uVar26 == 0xf) || (uVar7 < 8)) || (pBVar21 < __src)) goto LAB_00112b1c;
    *(undefined8 *)pBVar24 = *(undefined8 *)pBVar21;
    *(undefined8 *)(pBVar24 + 8) = *(undefined8 *)(pBVar21 + 8);
    *(undefined2 *)(pBVar24 + 0x10) = *(undefined2 *)(pBVar21 + 0x10);
    puVar23 = __src_00;
    pBVar25 = pBVar24 + uVar26 + 4;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src_00) goto LAB_001129c8;
  puVar23 = puVar23 + 1;
  uVar11 = 0;
  do {
    uVar7 = *__src_00;
    __src_00 = (ushort *)((long)__src_00 + 1);
    uVar11 = uVar11 + (byte)uVar7;
    puVar23 = (ushort *)((long)puVar23 + 1);
  } while (__src_00 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar7 == 0xff);
  uVar18 = (ulong)uVar11 + 0xf;
  if ((CARRY8((ulong)pBVar25,uVar18)) || ((ulong)-(long)puVar23 < uVar18)) goto LAB_001129c8;
LAB_00112aca:
  pBVar24 = pBVar25 + uVar18;
  uVar11 = (uint)bVar5;
LAB_00112ace:
  puVar23 = (ushort *)(uVar18 + (long)__src_00);
  if ((pBVar24 <= pBVar2 + -0xc) && (puVar23 <= puVar1 + -4)) {
    do {
      *(undefined8 *)pBVar25 = *(undefined8 *)__src_00;
      pBVar25 = pBVar25 + 8;
      __src_00 = __src_00 + 4;
    } while (pBVar25 < pBVar24);
    uVar18 = (ulong)*puVar23;
    __src_00 = puVar23 + 1;
    pBVar21 = pBVar24 + -uVar18;
    uVar26 = (ulong)(uVar11 & 0xf);
LAB_00112b1c:
    if ((int)uVar26 == 0xf) {
      uVar11 = 0;
      do {
        uVar7 = *__src_00;
        __src_00 = (ushort *)((long)__src_00 + 1);
        uVar11 = uVar11 + (byte)uVar7;
      } while ((byte)uVar7 == 0xff && __src_00 < puVar1 + -2);
      uVar26 = (ulong)uVar11 + 0xf;
      if ((puVar1 + -2 <= __src_00) || (CARRY8((ulong)pBVar24,uVar26))) goto LAB_001129c8;
    }
    __n = uVar26 + 4;
    goto LAB_00112b75;
  }
  if ((puVar23 == puVar1) && (pBVar24 <= pBVar2)) {
    memmove(pBVar25,__src_00,uVar18);
    local_88 = (int)dest;
    uVar11 = ((int)pBVar25 + (int)uVar18) - local_88;
    goto LAB_001129a9;
  }
LAB_001129c8:
  local_78 = (int)source;
  uVar11 = ~(uint)__src_00 + local_78;
LAB_001129a9:
  if (0 < (int)uVar11) {
    LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + (ulong)uVar11;
    (LZ4_streamDecode->internal_donotuse).prefixEnd =
         (LZ4_streamDecode->internal_donotuse).prefixEnd + uVar11;
  }
  return uVar11;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}